

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall miniros::Connection::drop(Connection *this,DropReason reason)

{
  bool bVar1;
  DropWatcher *pDVar2;
  element_type *peVar3;
  uint in_ESI;
  iterator_t it;
  scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_> lock;
  bool did_drop;
  bool enabled;
  char *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Iterator<miniros::Connection::DropWatcher> *in_stack_ffffffffffffff38;
  LogLocation *in_stack_ffffffffffffff40;
  Level in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  LogLocation *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 local_70 [16];
  Iterator<miniros::Connection::DropWatcher> local_60;
  Iterator<miniros::Connection::DropWatcher> local_58 [2];
  byte local_46;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30 [36];
  uint local_c;
  
  local_c = in_ESI;
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((drop::loc.initialized_ ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,(allocator<char> *)in_stack_ffffffffffffff60);
    console::initializeLogLocation
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  if (drop::loc.level_ != Debug) {
    console::setLogLocationLevel
              ((LogLocation *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (Level)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    console::checkLogLocationEnabled(in_stack_ffffffffffffff40);
  }
  local_45 = (drop::loc.logger_enabled_ & 1U) != 0;
  if ((bool)local_45) {
    in_stack_ffffffffffffff28 = "Connection::drop(%u)";
    in_stack_ffffffffffffff30 = local_c;
    console::print((FilterBase *)0x0,drop::loc.logger_,(Level)(ulong)drop::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp"
                   ,0x158,"void miniros::Connection::drop(DropReason)");
  }
  local_46 = 0;
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff38);
  if (!bVar1) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
    local_46 = 1;
  }
  if ((local_46 & 1) != 0) {
    std::scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_>::scoped_lock
              ((scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (mutex_type *)in_stack_ffffffffffffff28);
    local_58[0].m_obj =
         (DropWatcher *)
         observer::Target<miniros::Connection::DropWatcher>::begin
                   ((Target<miniros::Connection::DropWatcher> *)in_stack_ffffffffffffff28);
    while( true ) {
      local_60.m_obj =
           (DropWatcher *)
           observer::Target<miniros::Connection::DropWatcher>::end
                     ((Target<miniros::Connection::DropWatcher> *)in_stack_ffffffffffffff28);
      bVar1 = observer::operator!=(local_58,&local_60);
      if ((!bVar1) ||
         (bVar1 = observer::Iterator::operator_cast_to_bool((Iterator *)local_58), !bVar1)) break;
      pDVar2 = observer::Iterator<miniros::Connection::DropWatcher>::operator->(local_58);
      std::enable_shared_from_this<miniros::Connection>::shared_from_this
                ((enable_shared_from_this<miniros::Connection> *)in_stack_ffffffffffffff28);
      (*(pDVar2->super_Connection)._vptr_Connection[2])(pDVar2,local_70,(ulong)local_c);
      std::shared_ptr<miniros::Connection>::~shared_ptr((shared_ptr<miniros::Connection> *)0x42c049)
      ;
      observer::Iterator<miniros::Connection::DropWatcher>::operator++
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    }
    std::scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_>::~scoped_lock
              ((scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_> *)0x42c09b
              );
    peVar3 = std::__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x42c0a9);
    (*peVar3->_vptr_Transport[8])();
  }
  return;
}

Assistant:

void Connection::drop(DropReason reason)
{
  MINIROS_DEBUG("Connection::drop(%u)", reason);
  bool did_drop = false;
  {
    if (!dropped_)
    {
      dropped_ = true;
      did_drop = true;
    }
  }

  if (did_drop)
  {
    {
        std::scoped_lock<DropWatchers> lock(drop_watchers_);
        for (auto it = drop_watchers_.begin(); it != drop_watchers_.end(); it++)
        {
            if (!it)
              break;
            it->onConnectionDropped(shared_from_this(), reason);
        }
    }
    transport_->close();
  }
}